

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward.hpp
# Opt level: O0

void __thiscall
backward::TraceResolverLinuxImpl<backward::trace_resolver_tag::backtrace_symbol>::
~TraceResolverLinuxImpl
          (TraceResolverLinuxImpl<backward::trace_resolver_tag::backtrace_symbol> *this)

{
  TraceResolverLinuxBase *in_RDI;
  
  (in_RDI->super_TraceResolverImplBase)._vptr_TraceResolverImplBase =
       (_func_int **)&PTR__TraceResolverLinuxImpl_00256b88;
  details::handle<char_**,_backward::details::deleter<void,_void_*,_&free>_>::~handle
            ((handle<char_**,_backward::details::deleter<void,_void_*,_&free>_> *)in_RDI);
  TraceResolverLinuxBase::~TraceResolverLinuxBase(in_RDI);
  return;
}

Assistant:

void load_addresses(void *const*addresses, int address_count) override {
    if (address_count == 0) {
      return;
    }
    _symbols.reset(backtrace_symbols(addresses, address_count));
  }